

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  float *pfVar1;
  value_type local_1c;
  
  pfVar1 = GetStyleVarFloatAddr(idx);
  if (pfVar1 != (float *)0x0) {
    local_1c.PreviousValue.x = *pfVar1;
    local_1c.PreviousValue.y = 0.0;
    local_1c.Var = idx;
    ImVector<ImGuiStyleMod>::push_back(&GImGui->StyleModifiers,&local_1c);
    *pfVar1 = val;
    return;
  }
  __assert_fail("pvar != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x124d,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    ImGuiContext& g = *GImGui;
    float* pvar = GetStyleVarFloatAddr(idx);
    IM_ASSERT(pvar != NULL); // Called function with wrong-type? Variable is not a float.
    ImGuiStyleMod backup;
    backup.Var = idx;
    backup.PreviousValue = ImVec2(*pvar, 0.0f);
    g.StyleModifiers.push_back(backup);
    *pvar = val;
}